

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  string *text;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &bStack_58;
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    text = &(this->tokenizer_).current_.text;
    bVar1 = io::Tokenizer::ParseInteger(text,max_value,value);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    std::operator+(&local_38,"Integer out of range (",text);
    std::operator+(&bStack_58,&local_38,")");
    ReportError(this,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    this_00 = &local_38;
  }
  else {
    std::operator+(&bStack_58,"Expected integer, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,&bStack_58);
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ConsumeUnsignedInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text,
                                     max_value, value)) {
      ReportError("Integer out of range (" + tokenizer_.current().text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }